

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O2

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Particle *pPVar4;
  pointer pPVar5;
  double *pdVar6;
  bool bVar7;
  byte bVar8;
  Particle<(pica::Dimension)3> in_stack_fffffffffffffe98;
  Particle<(pica::Dimension)3> in_stack_fffffffffffffee0;
  AssertHelper local_d8;
  AssertionResult gtest_ar__1;
  ParticleArray particlesCopy;
  ParticleArray particles;
  String local_90;
  AssertHelper local_80;
  ParticleType particle;
  
  bVar8 = 0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  particles.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = 0xd;
  while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&particle,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this);
    std::
    vector<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ::push_back(&particles.particles,&particle);
    pPVar5 = particles.particles.
             super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    lVar2 = 9;
    pPVar4 = &particle;
    pdVar6 = (double *)&stack0xfffffffffffffe98;
    for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar6 = (pPVar4->position).x;
      pPVar4 = (Particle *)((long)pPVar4 + (ulong)bVar8 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar8 * -2 + 1;
    }
    pdVar6 = (double *)&stack0xfffffffffffffee0;
    for (; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pdVar6 = (pPVar5->position).x;
      pPVar5 = (pointer)((long)pPVar5 + (ulong)bVar8 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar8 * -2 + 1;
    }
    particlesCopy.particles.
    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ =
         BaseParticleFixture<pica::Particle<(pica::Dimension)3>>::
         eqParticles_<pica::Particle<(pica::Dimension)3>,pica::Particle<(pica::Dimension)3>>
                   ((BaseParticleFixture<pica::Particle<(pica::Dimension)3>> *)this,
                    in_stack_fffffffffffffe98,in_stack_fffffffffffffee0);
    particlesCopy.particles.
    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (!(bool)particlesCopy.particles.
               super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_1_) {
      testing::Message::Message((Message *)&local_90);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&gtest_ar__1,(AssertionResult *)&particlesCopy,
                 "this->eqParticles_(particle, particles.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x67,(char *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_));
      testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_90);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::internal::String::~String((String *)&gtest_ar__1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_90);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&particlesCopy.particles.
                    super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ::vector(&particlesCopy.particles,&particles.particles);
    pPVar5 = particlesCopy.particles.
             super__Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    lVar2 = 9;
    pPVar4 = &particle;
    pdVar6 = (double *)&stack0xfffffffffffffe98;
    for (lVar1 = lVar2; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar6 = (pPVar4->position).x;
      pPVar4 = (Particle *)((long)pPVar4 + (ulong)bVar8 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar8 * -2 + 1;
    }
    pdVar6 = (double *)&stack0xfffffffffffffee0;
    for (; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pdVar6 = (pPVar5->position).x;
      pPVar5 = (pointer)((long)pPVar5 + (ulong)bVar8 * -0x10 + 8);
      pdVar6 = pdVar6 + (ulong)bVar8 * -2 + 1;
    }
    gtest_ar__1.success_ =
         BaseParticleFixture<pica::Particle<(pica::Dimension)3>>::
         eqParticles_<pica::Particle<(pica::Dimension)3>,pica::Particle<(pica::Dimension)3>>
                   ((BaseParticleFixture<pica::Particle<(pica::Dimension)3>> *)this,
                    in_stack_fffffffffffffe98,in_stack_fffffffffffffee0);
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_90,&gtest_ar__1,
                 "this->eqParticles_(particle, particlesCopy.back())","false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x69,local_90.c_str_);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      testing::internal::String::~String(&local_90);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    std::
    _Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
    ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                     *)&particlesCopy);
  }
  std::
  _Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
  ::~_Vector_base((_Vector_base<pica::Particle<(pica::Dimension)3>,_std::allocator<pica::Particle<(pica::Dimension)3>_>_>
                   *)&particles);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}